

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O2

uint __thiscall lzham::symbol_codec::get_bits(symbol_codec *this,uint num_bits)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  byte *pbVar4;
  
  if (num_bits == 0) {
    return 0;
  }
  iVar3 = this->m_bit_count;
  do {
    if ((int)num_bits <= iVar3) {
      uVar2 = this->m_bit_buf;
      this->m_bit_buf = uVar2 << ((byte)num_bits & 0x3f);
      this->m_bit_count = iVar3 - num_bits;
      return (uint)(uVar2 >> (-(byte)num_bits & 0x3f));
    }
    pbVar4 = this->m_pDecode_buf_next;
    if (pbVar4 == this->m_pDecode_buf_end) {
      if (this->m_decode_buf_eof == false) {
        (*this->m_pDecode_need_bytes_func)
                  ((long)pbVar4 - (long)this->m_pDecode_buf,this->m_pDecode_private_data,
                   &this->m_pDecode_buf,&this->m_decode_buf_size,&this->m_decode_buf_eof);
        pbVar4 = this->m_pDecode_buf;
        this->m_pDecode_buf_end = pbVar4 + this->m_decode_buf_size;
        this->m_pDecode_buf_next = pbVar4;
        if (0 < (long)this->m_decode_buf_size) goto LAB_00115b6a;
      }
      uVar2 = 0;
    }
    else {
LAB_00115b6a:
      this->m_pDecode_buf_next = pbVar4 + 1;
      uVar2 = (ulong)*pbVar4;
    }
    iVar1 = this->m_bit_count;
    iVar3 = iVar1 + 8;
    this->m_bit_count = iVar3;
    this->m_bit_buf = this->m_bit_buf | uVar2 << (0x38U - (char)iVar1 & 0x3f);
  } while( true );
}

Assistant:

uint symbol_codec::get_bits(uint num_bits)
   {
      LZHAM_ASSERT(num_bits <= 25);

      if (!num_bits)
         return 0;

      while (m_bit_count < (int)num_bits)
      {
         uint c = 0;
         if (m_pDecode_buf_next == m_pDecode_buf_end)
         {
            if (!m_decode_buf_eof)
            {
               m_pDecode_need_bytes_func(m_pDecode_buf_next - m_pDecode_buf, m_pDecode_private_data, m_pDecode_buf, m_decode_buf_size, m_decode_buf_eof);
               m_pDecode_buf_end = m_pDecode_buf + m_decode_buf_size;
               m_pDecode_buf_next = m_pDecode_buf;
               if (m_pDecode_buf_next < m_pDecode_buf_end) c = *m_pDecode_buf_next++;
            }
         }
         else
            c = *m_pDecode_buf_next++;

         m_bit_count += 8;
         LZHAM_ASSERT(m_bit_count <= cBitBufSize);

         m_bit_buf |= (static_cast<bit_buf_t>(c) << (cBitBufSize - m_bit_count));
      }

      uint result = static_cast<uint>(m_bit_buf >> (cBitBufSize - num_bits));

      m_bit_buf <<= num_bits;
      m_bit_count -= num_bits;

      return result;
   }